

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::OneofTest_MergeFrom_Test::TestBody
          (OneofTest_MergeFrom_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  undefined8 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  Arena *pAVar5;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr;
  string_view value;
  string_view value_00;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  TestOneof2 message1;
  TestOneof2 message2;
  AssertHelper local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  AssertHelper local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_90 [64];
  TestOneof2 local_50;
  
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_90,(Arena *)0x0);
  proto2_unittest::TestOneof2::TestOneof2(&local_50,(Arena *)0x0);
  if (local_90._56_4_ != 1) {
    proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_90);
    local_90._56_4_ = 1;
  }
  local_90._40_4_ = 0x7b;
  proto2_unittest::TestOneof2::MergeImpl((MessageLite *)&local_50,(MessageLite *)local_90);
  TestUtil::ExpectAtMostOneFieldSetInOneof<proto2_unittest::TestOneof2>(&local_50);
  local_c8._M_head_impl._0_1_ = local_50.field_0._impl_._oneof_case_[0] == 1;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_50.field_0._impl_._oneof_case_[0] != 1) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)&local_c8,(AssertionResult *)"message2.has_foo_int()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x7f5,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  uVar2 = 0;
  if (local_50.field_0._impl_._oneof_case_[0] == 1) {
    uVar2 = local_50.field_0._24_4_;
  }
  local_c8._M_head_impl._0_4_ = uVar2;
  local_d0.data_._0_4_ = 0x7b;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b0,"message2.foo_int()","123",(int *)&local_c8,(int *)&local_d0);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar6 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x7f6,pcVar6);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  if (local_90._56_4_ != 2) {
    proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_90);
    local_90._56_4_ = 2;
    local_90._40_8_ = &protobuf::internal::fixed_address_empty_string;
  }
  pAVar5 = (Arena *)local_90._8_8_;
  if ((local_90._8_8_ & 1) != 0) {
    pAVar5 = *(Arena **)(local_90._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(local_90 + 0x28),value,pAVar5);
  proto2_unittest::TestOneof2::MergeImpl((MessageLite *)&local_50,(MessageLite *)local_90);
  TestUtil::ExpectAtMostOneFieldSetInOneof<proto2_unittest::TestOneof2>(&local_50);
  local_c8._M_head_impl._0_1_ = local_50.field_0._impl_._oneof_case_[0] == 2;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_50.field_0._impl_._oneof_case_[0] != 2) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)&local_c8,
               (AssertionResult *)"message2.has_foo_string()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x7fb,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  if (local_50.field_0._impl_._oneof_case_[0] == 2) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT44(local_50.field_0._28_4_,local_50.field_0._24_4_) & 0xfffffffffffffffc);
  }
  else {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &protobuf::internal::fixed_address_empty_string;
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_b0,"message2.foo_string()","\"foo\"",pbVar4,(char (*) [4])0x11364a4);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar6 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x7fc,pcVar6);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  if (local_90._56_4_ != 5) {
    proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_90);
    local_90._56_4_ = 5;
    local_90._40_8_ = &protobuf::internal::fixed_address_empty_string;
  }
  pAVar5 = (Arena *)local_90._8_8_;
  if ((local_90._8_8_ & 1) != 0) {
    pAVar5 = *(Arena **)(local_90._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "moo";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(local_90 + 0x28),value_00,pAVar5);
  proto2_unittest::TestOneof2::MergeImpl((MessageLite *)&local_50,(MessageLite *)local_90);
  TestUtil::ExpectAtMostOneFieldSetInOneof<proto2_unittest::TestOneof2>(&local_50);
  local_c8._M_head_impl._0_1_ = local_50.field_0._impl_._oneof_case_[0] == 5;
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_50.field_0._impl_._oneof_case_[0] != 5) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)&local_c8,
               (AssertionResult *)"message2.has_foo_bytes()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x802,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  if (local_50.field_0._impl_._oneof_case_[0] == 5) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT44(local_50.field_0._28_4_,local_50.field_0._24_4_) & 0xfffffffffffffffc);
  }
  else {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &protobuf::internal::fixed_address_empty_string;
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_b0,"message2.foo_bytes()","\"moo\"",pbVar4,(char (*) [4])0x10c6bdd);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar6 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x803,pcVar6);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  bVar1 = protobuf::internal::ValidateEnum
                    (1,(uint32_t *)&proto2_unittest::TestOneof2_NestedEnum_internal_data_);
  if (bVar1) {
    if (local_90._56_4_ != 6) {
      proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_90);
      local_90._56_4_ = 6;
    }
    local_90._40_4_ = 1;
    proto2_unittest::TestOneof2::MergeImpl((MessageLite *)&local_50,(MessageLite *)local_90);
    TestUtil::ExpectAtMostOneFieldSetInOneof<proto2_unittest::TestOneof2>(&local_50);
    local_c8._M_head_impl._0_1_ = local_50.field_0._impl_._oneof_case_[0] == 6;
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_50.field_0._impl_._oneof_case_[0] != 6) {
      testing::Message::Message((Message *)&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b0,(internal *)&local_c8,
                 (AssertionResult *)"message2.has_foo_enum()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x808,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    uVar2 = 1;
    if (local_50.field_0._impl_._oneof_case_[0] == 6) {
      uVar2 = local_50.field_0._24_4_;
    }
    local_c8._M_head_impl._0_4_ = uVar2;
    testing::internal::
    CmpHelperEQ<proto2_unittest::TestOneof2_NestedEnum,proto2_unittest::TestOneof2_NestedEnum>
              ((internal *)local_b0,"message2.foo_enum()","::proto2_unittest::TestOneof2::FOO",
               (TestOneof2_NestedEnum *)&local_c8,&proto2_unittest::TestOneof2::FOO);
    if (local_b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar6 = (local_a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x809,pcVar6);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    if (local_90._56_4_ != 7) {
      proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_90);
      local_90._56_4_ = 7;
      pAVar5 = (Arena *)local_90._8_8_;
      if ((local_90._8_8_ & 1) != 0) {
        pAVar5 = *(Arena **)(local_90._8_8_ & 0xfffffffffffffffe);
      }
      local_90._40_8_ = Arena::DefaultConstruct<proto2_unittest::TestOneof2_NestedMessage>(pAVar5);
    }
    (((Message *)(local_90._40_8_ + 0x30))->super_MessageLite)._vptr_MessageLite =
         (_func_int **)0xea;
    *(byte *)&(((Message *)(local_90._40_8_ + 0x10))->super_MessageLite)._vptr_MessageLite =
         *(byte *)&(((Message *)(local_90._40_8_ + 0x10))->super_MessageLite)._vptr_MessageLite | 2;
    proto2_unittest::TestOneof2::MergeImpl((MessageLite *)&local_50,(MessageLite *)local_90);
    TestUtil::ExpectAtMostOneFieldSetInOneof<proto2_unittest::TestOneof2>(&local_50);
    local_c8._M_head_impl._0_1_ = local_50.field_0._impl_._oneof_case_[0] == 7;
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_50.field_0._impl_._oneof_case_[0] != 7) {
      testing::Message::Message((Message *)&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b0,(internal *)&local_c8,
                 (AssertionResult *)"message2.has_foo_message()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x80e,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    if (local_50.field_0._impl_._oneof_case_[0] == 7) {
      puVar3 = (undefined8 *)CONCAT44(local_50.field_0._28_4_,local_50.field_0._24_4_);
    }
    else {
      puVar3 = &proto2_unittest::_TestOneof2_NestedMessage_default_instance_;
    }
    local_c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar3[6];
    local_d0.data_._0_4_ = 0xea;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)local_b0,"message2.foo_message().moo_int()","234",(long *)&local_c8,
               (int *)&local_d0);
    if (local_b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar6 = (local_a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x80f,pcVar6);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    if (local_90._56_4_ != 8) {
      proto2_unittest::TestOneof2::clear_foo((TestOneof2 *)local_90);
      local_90._56_4_ = 8;
      if ((local_90._8_8_ & 1) != 0) {
        local_90._8_8_ = *(undefined8 *)(local_90._8_8_ & 0xfffffffffffffffe);
      }
      local_90._40_8_ =
           Arena::DefaultConstruct<proto2_unittest::TestOneof2_FooGroup>((Arena *)local_90._8_8_);
    }
    *(undefined4 *)&(((Message *)(local_90._40_8_ + 0x20))->super_MessageLite)._vptr_MessageLite =
         0x159;
    *(byte *)&(((Message *)(local_90._40_8_ + 0x10))->super_MessageLite)._vptr_MessageLite =
         *(byte *)&(((Message *)(local_90._40_8_ + 0x10))->super_MessageLite)._vptr_MessageLite | 2;
    proto2_unittest::TestOneof2::MergeImpl((MessageLite *)&local_50,(MessageLite *)local_90);
    TestUtil::ExpectAtMostOneFieldSetInOneof<proto2_unittest::TestOneof2>(&local_50);
    local_c8._M_head_impl._0_1_ = local_50.field_0._impl_._oneof_case_[0] == 8;
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_50.field_0._impl_._oneof_case_[0] != 8) {
      testing::Message::Message((Message *)&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b0,(internal *)&local_c8,
                 (AssertionResult *)"message2.has_foogroup()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x814,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    if (local_50.field_0._impl_._oneof_case_[0] == 8) {
      puVar3 = (undefined8 *)CONCAT44(local_50.field_0._28_4_,local_50.field_0._24_4_);
    }
    else {
      puVar3 = &proto2_unittest::_TestOneof2_FooGroup_default_instance_;
    }
    local_c8._M_head_impl._0_4_ = *(undefined4 *)(puVar3 + 4);
    local_d0.data_._0_4_ = 0x159;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_b0,"message2.foogroup().a()","345",(int *)&local_c8,
               (int *)&local_d0);
    if (local_b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar6 = (local_a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
                 ,0x815,pcVar6);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    proto2_unittest::TestOneof2::~TestOneof2(&local_50);
    proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_90);
    return;
  }
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestOneof2_NestedEnum_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.h"
                ,0xf6a3,
                "void proto2_unittest::TestOneof2::set_foo_enum(::proto2_unittest::TestOneof2_NestedEnum)"
               );
}

Assistant:

TEST_F(OneofTest, MergeFrom) {
  UNITTEST::TestOneof2 message1, message2;

  message1.set_foo_int(123);
  message2.MergeFrom(message1);
  TestUtil::ExpectAtMostOneFieldSetInOneof(message2);
  EXPECT_TRUE(message2.has_foo_int());
  EXPECT_EQ(message2.foo_int(), 123);

  message1.set_foo_string("foo");
  message2.MergeFrom(message1);
  TestUtil::ExpectAtMostOneFieldSetInOneof(message2);
  EXPECT_TRUE(message2.has_foo_string());
  EXPECT_EQ(message2.foo_string(), "foo");


  message1.set_foo_bytes("moo");
  message2.MergeFrom(message1);
  TestUtil::ExpectAtMostOneFieldSetInOneof(message2);
  EXPECT_TRUE(message2.has_foo_bytes());
  EXPECT_EQ(message2.foo_bytes(), "moo");

  message1.set_foo_enum(UNITTEST::TestOneof2::FOO);
  message2.MergeFrom(message1);
  TestUtil::ExpectAtMostOneFieldSetInOneof(message2);
  EXPECT_TRUE(message2.has_foo_enum());
  EXPECT_EQ(message2.foo_enum(), UNITTEST::TestOneof2::FOO);

  message1.mutable_foo_message()->set_moo_int(234);
  message2.MergeFrom(message1);
  TestUtil::ExpectAtMostOneFieldSetInOneof(message2);
  EXPECT_TRUE(message2.has_foo_message());
  EXPECT_EQ(message2.foo_message().moo_int(), 234);

  message1.mutable_foogroup()->set_a(345);
  message2.MergeFrom(message1);
  TestUtil::ExpectAtMostOneFieldSetInOneof(message2);
  EXPECT_TRUE(message2.has_foogroup());
  EXPECT_EQ(message2.foogroup().a(), 345);

}